

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

SurfaceInfo * Omega_h::get_surface_info(SurfaceInfo *__return_storage_ptr__,Mesh *mesh)

{
  Reals surf_vert_normals;
  Int IVar1;
  int ent_dim;
  void *in_stack_fffffffffffffd50;
  Reals curv_edge_tangents;
  Write<int> local_298;
  Write<int> local_288;
  Reals curv_vert_tangents;
  Reals surf_tri_IIs;
  Reals curv_edge_curvatures;
  LOs surf_vert2vert;
  LOs surf_side2side;
  Reals curv_vert_curvatures;
  Write<int> local_218;
  Write<double> local_208;
  Write<int> local_1f8;
  Write<double> local_1e8;
  Write<int> local_1d8;
  Write<double> local_1c8;
  Write<int> local_1b8;
  Write<int> local_1a8;
  Write<double> local_198;
  Write<int> local_188;
  Write<int> local_178;
  Write<int> local_168;
  Write<double> local_158;
  Write<double> local_148;
  Write<int> local_138;
  Write<double> local_128;
  Write<int> local_118;
  Write<double> local_108;
  Write<int> local_f8;
  Write<signed_char> local_e8;
  Write<signed_char> local_d8;
  Write<int> local_c8;
  Write<double> local_b8;
  Write<int> local_a8;
  Write<int> local_98;
  Write<signed_char> local_88;
  Write<signed_char> local_78;
  Read<signed_char> verts_are_surf;
  Read<signed_char> sides_are_surf;
  Write<double> local_48;
  Reals surf_vert_IIs;
  
  (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.direct_ptr = (void *)0x0;
  IVar1 = Mesh::dim(mesh);
  if (IVar1 != 1) {
    IVar1 = Mesh::dim(mesh);
    ent_dim = IVar1 + -1;
    mark_by_class_dim((Omega_h *)&sides_are_surf,mesh,ent_dim,ent_dim);
    mark_by_class_dim((Omega_h *)&verts_are_surf,mesh,0,ent_dim);
    Write<signed_char>::Write(&local_78,&sides_are_surf.write_);
    collect_marked((Omega_h *)&surf_side2side,(Read<signed_char> *)&local_78);
    Write<signed_char>::~Write(&local_78);
    Write<signed_char>::Write(&local_88,&verts_are_surf.write_);
    collect_marked((Omega_h *)&surf_vert2vert,(Read<signed_char> *)&local_88);
    Write<signed_char>::~Write(&local_88);
    local_288.shared_alloc_.alloc = (Alloc *)0x0;
    local_288.shared_alloc_.direct_ptr = (void *)0x0;
    local_298.shared_alloc_.alloc = (Alloc *)0x0;
    local_298.shared_alloc_.direct_ptr = (void *)0x0;
    IVar1 = Mesh::dim(mesh);
    if (IVar1 == 3) {
      Write<int>::Write(&local_98,&surf_side2side.write_);
      get_side_vectors((Omega_h *)&curv_edge_tangents,mesh,(LOs *)&local_98);
      Write<int>::~Write(&local_98);
      Write<int>::Write(&local_a8,&surf_side2side.write_);
      Write<double>::Write(&local_b8,&curv_edge_tangents.write_);
      Write<int>::Write(&local_c8,&surf_vert2vert.write_);
      get_side_vert_normals
                ((Omega_h *)&curv_vert_tangents,mesh,(LOs *)&local_a8,(Reals *)&local_b8,
                 (LOs *)&local_c8);
      Write<int>::~Write(&local_c8);
      Write<double>::~Write(&local_b8);
      Write<int>::~Write(&local_a8);
      mark_by_class_dim((Omega_h *)&curv_edge_curvatures,mesh,1,1);
      mark_by_class_dim((Omega_h *)&curv_vert_curvatures,mesh,0,1);
      Write<signed_char>::Write(&local_d8,(Write<signed_char> *)&curv_edge_curvatures);
      collect_marked((Omega_h *)&surf_tri_IIs,(Read<signed_char> *)&local_d8);
      Write<int>::operator=(&local_288,(Write<int> *)&surf_tri_IIs);
      Write<int>::~Write((Write<int> *)&surf_tri_IIs);
      Write<signed_char>::~Write(&local_d8);
      Write<signed_char>::Write(&local_e8,(Write<signed_char> *)&curv_vert_curvatures);
      collect_marked((Omega_h *)&surf_tri_IIs,(Read<signed_char> *)&local_e8);
      Write<int>::operator=(&local_298,(Write<int> *)&surf_tri_IIs);
      Write<int>::~Write((Write<int> *)&surf_tri_IIs);
      Write<signed_char>::~Write(&local_e8);
      Write<int>::Write(&local_f8,&surf_side2side.write_);
      Write<double>::Write(&local_108,&curv_edge_tangents.write_);
      Write<int>::Write(&local_118,&surf_vert2vert.write_);
      Write<double>::Write(&local_128,&curv_vert_tangents.write_);
      get_surf_tri_IIs((Omega_h *)&surf_tri_IIs,mesh,(LOs *)&local_f8,(Reals *)&local_108,
                       (LOs *)&local_118,(Reals *)&local_128);
      Write<double>::~Write(&local_128);
      Write<int>::~Write(&local_118);
      Write<double>::~Write(&local_108);
      Write<int>::~Write(&local_f8);
      Write<int>::Write(&local_138,&surf_side2side.write_);
      Write<double>::Write(&local_148,&curv_edge_tangents.write_);
      Write<double>::Write(&local_158,&surf_tri_IIs.write_);
      Write<int>::Write(&local_168,&surf_vert2vert.write_);
      Write<double>::Write(&local_48,&curv_vert_tangents.write_);
      surf_vert_normals.write_.shared_alloc_.direct_ptr = in_stack_fffffffffffffd50;
      surf_vert_normals.write_.shared_alloc_.alloc = (Alloc *)&local_48;
      get_surf_vert_IIs((Omega_h *)&surf_vert_IIs,mesh,(LOs *)&local_138,(Reals *)&local_148,
                        (Reals *)&local_158,(LOs *)&local_168,surf_vert_normals);
      Write<double>::~Write(&local_48);
      Write<int>::~Write(&local_168);
      Write<double>::~Write(&local_158);
      Write<double>::~Write(&local_148);
      Write<int>::~Write(&local_138);
      Write<int>::operator=((Write<int> *)__return_storage_ptr__,&surf_vert2vert.write_);
      Write<double>::operator=
                (&(__return_storage_ptr__->surf_vert_normals).write_,&curv_vert_tangents.write_);
      Write<double>::operator=
                (&(__return_storage_ptr__->surf_vert_IIs).write_,&surf_vert_IIs.write_);
      Write<double>::~Write(&surf_vert_IIs.write_);
      Write<double>::~Write(&surf_tri_IIs.write_);
      Write<signed_char>::~Write((Write<signed_char> *)&curv_vert_curvatures);
      Write<signed_char>::~Write((Write<signed_char> *)&curv_edge_curvatures);
      Write<double>::~Write(&curv_vert_tangents.write_);
      Write<double>::~Write(&curv_edge_tangents.write_);
    }
    else {
      Write<int>::operator=(&local_288,&surf_side2side.write_);
      Write<int>::operator=(&local_298,&surf_vert2vert.write_);
    }
    Write<int>::Write(&local_178,&local_288);
    get_curv_edge_tangents((Omega_h *)&curv_edge_tangents,mesh,(LOs *)&local_178);
    Write<int>::~Write(&local_178);
    Write<int>::Write(&local_188,&local_288);
    Write<double>::Write(&local_198,&curv_edge_tangents.write_);
    Write<int>::Write(&local_1a8,&local_298);
    get_curv_vert_tangents
              ((Omega_h *)&curv_vert_tangents,mesh,(LOs *)&local_188,(Reals *)&local_198,
               (LOs *)&local_1a8);
    Write<int>::~Write(&local_1a8);
    Write<double>::~Write(&local_198);
    Write<int>::~Write(&local_188);
    Write<int>::Write(&local_1b8,&local_288);
    Write<double>::Write(&local_1c8,&curv_edge_tangents.write_);
    Write<int>::Write(&local_1d8,&local_298);
    Write<double>::Write(&local_1e8,&curv_vert_tangents.write_);
    get_curv_edge_curvatures
              ((Omega_h *)&curv_edge_curvatures,mesh,(LOs *)&local_1b8,(Reals *)&local_1c8,
               (LOs *)&local_1d8,(Reals *)&local_1e8);
    Write<double>::~Write(&local_1e8);
    Write<int>::~Write(&local_1d8);
    Write<double>::~Write(&local_1c8);
    Write<int>::~Write(&local_1b8);
    Write<int>::Write(&local_1f8,&local_288);
    Write<double>::Write(&local_208,&curv_edge_curvatures.write_);
    Write<int>::Write(&local_218,&local_298);
    get_curv_vert_curvatures
              ((Omega_h *)&curv_vert_curvatures,mesh,(LOs *)&local_1f8,(Reals *)&local_208,
               (LOs *)&local_218);
    Write<int>::~Write(&local_218);
    Write<double>::~Write(&local_208);
    Write<int>::~Write(&local_1f8);
    Write<int>::operator=(&(__return_storage_ptr__->curv_vert2vert).write_,&local_298);
    Write<double>::operator=
              (&(__return_storage_ptr__->curv_vert_tangents).write_,&curv_vert_tangents.write_);
    Write<double>::operator=
              (&(__return_storage_ptr__->curv_vert_curvatures).write_,&curv_vert_curvatures.write_);
    Write<double>::~Write(&curv_vert_curvatures.write_);
    Write<double>::~Write(&curv_edge_curvatures.write_);
    Write<double>::~Write(&curv_vert_tangents.write_);
    Write<double>::~Write(&curv_edge_tangents.write_);
    Write<int>::~Write(&local_298);
    Write<int>::~Write(&local_288);
    Write<int>::~Write(&surf_vert2vert.write_);
    Write<int>::~Write(&surf_side2side.write_);
    Write<signed_char>::~Write(&verts_are_surf.write_);
    Write<signed_char>::~Write(&sides_are_surf.write_);
  }
  return __return_storage_ptr__;
}

Assistant:

SurfaceInfo get_surface_info(Mesh* mesh) {
  SurfaceInfo out;
  if (mesh->dim() == 1) return out;
  auto sdim = mesh->dim() - 1;
  auto sides_are_surf = mark_by_class_dim(mesh, sdim, sdim);
  auto verts_are_surf = mark_by_class_dim(mesh, VERT, sdim);
  auto surf_side2side = collect_marked(sides_are_surf);
  auto surf_vert2vert = collect_marked(verts_are_surf);
  LOs curv_edge2edge;
  LOs curv_vert2vert;
  if (mesh->dim() == 3) {
    auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
    auto surf_vert_normals = get_side_vert_normals(
        mesh, surf_side2side, surf_side_normals, surf_vert2vert);
    auto edges_are_curv = mark_by_class_dim(mesh, EDGE, EDGE);
    auto verts_are_curv = mark_by_class_dim(mesh, VERT, EDGE);
    curv_edge2edge = collect_marked(edges_are_curv);
    curv_vert2vert = collect_marked(verts_are_curv);
    auto surf_tri_IIs = get_surf_tri_IIs(mesh, surf_side2side,
        surf_side_normals, surf_vert2vert, surf_vert_normals);
    auto surf_vert_IIs = get_surf_vert_IIs(mesh, surf_side2side,
        surf_side_normals, surf_tri_IIs, surf_vert2vert, surf_vert_normals);
    out.surf_vert2vert = surf_vert2vert;
    out.surf_vert_normals = surf_vert_normals;
    out.surf_vert_IIs = surf_vert_IIs;
  } else {
    curv_edge2edge = surf_side2side;
    curv_vert2vert = surf_vert2vert;
  }
  auto curv_edge_tangents = get_curv_edge_tangents(mesh, curv_edge2edge);
  auto curv_vert_tangents = get_curv_vert_tangents(
      mesh, curv_edge2edge, curv_edge_tangents, curv_vert2vert);
  auto curv_edge_curvatures = get_curv_edge_curvatures(mesh, curv_edge2edge,
      curv_edge_tangents, curv_vert2vert, curv_vert_tangents);
  auto curv_vert_curvatures = get_curv_vert_curvatures(
      mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  out.curv_vert2vert = curv_vert2vert;
  out.curv_vert_tangents = curv_vert_tangents;
  out.curv_vert_curvatures = curv_vert_curvatures;
  return out;
}